

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_address.cc
# Opt level: O0

raptor_error
raptor_blocking_resolve_address(char *name,char *default_port,raptor_resolved_addresses **addresses)

{
  bool bVar1;
  int iVar2;
  char *__p;
  pointer pcVar3;
  pointer __service;
  void *pvVar4;
  addrinfo *in_RCX;
  RefCountedPtr<raptor::Status> local_f8;
  RefCountedPtr<raptor::Status> local_f0;
  char *local_e8;
  char *svc [2] [2];
  RefCountedPtr<raptor::Status> local_c0;
  RefCountedPtr<raptor::Status> local_b8 [3];
  StringView local_a0;
  UniquePtr<char> local_90;
  UniquePtr<char> port;
  UniquePtr<char> host;
  ulong local_78;
  size_t i;
  addrinfo *paStack_68;
  int s;
  addrinfo *resp;
  addrinfo *result;
  addrinfo hints;
  raptor_resolved_addresses **addresses_local;
  char *default_port_local;
  char *name_local;
  raptor_error *err;
  
  resp = (addrinfo *)0x0;
  hints.ai_next = in_RCX;
  default_port_local = default_port;
  name_local = name;
  raptor::RefCountedPtr<raptor::Status>::RefCountedPtr
            ((RefCountedPtr<raptor::Status> *)name,(nullptr_t)0x0);
  std::unique_ptr<char,raptor::DefaultDeleteChar>::unique_ptr<raptor::DefaultDeleteChar,void>
            ((unique_ptr<char,raptor::DefaultDeleteChar> *)&port);
  std::unique_ptr<char,raptor::DefaultDeleteChar>::unique_ptr<raptor::DefaultDeleteChar,void>
            ((unique_ptr<char,raptor::DefaultDeleteChar> *)&local_90);
  raptor::StringView::StringView(&local_a0,default_port_local);
  raptor::SplitHostPort(local_a0,&port,&local_90);
  bVar1 = std::operator==(&port,(nullptr_t)0x0);
  if (bVar1) {
    raptor::MakeStatusFromFormat<char_const(&)[27],char_const*&>
              ((raptor *)local_b8,(char (*) [27])"unparseable host:port (%s)",&default_port_local);
    raptor::RefCountedPtr<raptor::Status>::operator=((RefCountedPtr<raptor::Status> *)name,local_b8)
    ;
    raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(local_b8);
  }
  else {
    bVar1 = std::operator==(&local_90,(nullptr_t)0x0);
    if (bVar1) {
      if (addresses == (raptor_resolved_addresses **)0x0) {
        raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
                  ((raptor *)&local_c0,(char (*) [21])"no port in name (%s)",&default_port_local);
        raptor::RefCountedPtr<raptor::Status>::operator=
                  ((RefCountedPtr<raptor::Status> *)name,&local_c0);
        raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_c0);
        goto LAB_0011f3ac;
      }
      __p = raptor_strdup((char *)addresses);
      std::unique_ptr<char,_raptor::DefaultDeleteChar>::reset(&local_90,__p);
    }
    hints.ai_addr = (sockaddr *)0x0;
    hints.ai_canonname = (char *)0x0;
    hints.ai_socktype = 0;
    hints.ai_protocol = 0;
    hints.ai_addrlen = 0;
    hints._20_4_ = 0;
    hints.ai_flags = 1;
    hints.ai_family = 0;
    result = (addrinfo *)0x1;
    pcVar3 = std::unique_ptr<char,_raptor::DefaultDeleteChar>::get(&port);
    __service = std::unique_ptr<char,_raptor::DefaultDeleteChar>::get(&local_90);
    i._4_4_ = getaddrinfo(pcVar3,__service,(addrinfo *)&result,(addrinfo **)&resp);
    if (i._4_4_ != 0) {
      local_e8 = "http";
      svc[0][0] = "80";
      svc[0][1] = "https";
      svc[1][0] = "443";
      for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
        pcVar3 = std::unique_ptr<char,_raptor::DefaultDeleteChar>::get(&local_90);
        iVar2 = strcmp(pcVar3,svc[local_78 - 1][1]);
        if (iVar2 == 0) {
          pcVar3 = std::unique_ptr<char,_raptor::DefaultDeleteChar>::get(&port);
          i._4_4_ = getaddrinfo(pcVar3,svc[local_78][0],(addrinfo *)&result,(addrinfo **)&resp);
          break;
        }
      }
    }
    if (i._4_4_ == 0) {
      pvVar4 = raptor::Malloc(0x10);
      *(void **)hints.ai_next = pvVar4;
      **(undefined8 **)hints.ai_next = 0;
      for (paStack_68 = resp; paStack_68 != (addrinfo *)0x0; paStack_68 = paStack_68->ai_next) {
        **(long **)hints.ai_next = **(long **)hints.ai_next + 1;
      }
      pvVar4 = raptor::Malloc(**(long **)hints.ai_next * 0x84);
      *(void **)(*(long *)hints.ai_next + 8) = pvVar4;
      local_78 = 0;
      for (paStack_68 = resp; paStack_68 != (addrinfo *)0x0; paStack_68 = paStack_68->ai_next) {
        memcpy((void *)(*(long *)(*(long *)hints.ai_next + 8) + local_78 * 0x84),paStack_68->ai_addr
               ,(ulong)paStack_68->ai_addrlen);
        *(socklen_t *)(*(long *)(*(long *)hints.ai_next + 8) + local_78 * 0x84 + 0x80) =
             paStack_68->ai_addrlen;
        local_78 = local_78 + 1;
      }
      raptor::RefCountedPtr<raptor::Status>::RefCountedPtr(&local_f8,(nullptr_t)0x0);
      raptor::RefCountedPtr<raptor::Status>::operator=
                ((RefCountedPtr<raptor::Status> *)name,&local_f8);
      raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_f8);
    }
    else {
      raptor::MakeStatusFromPosixError((raptor *)&local_f0,"getaddrinfo");
      raptor::RefCountedPtr<raptor::Status>::operator=
                ((RefCountedPtr<raptor::Status> *)name,&local_f0);
      raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&local_f0);
    }
  }
LAB_0011f3ac:
  if (resp != (addrinfo *)0x0) {
    freeaddrinfo((addrinfo *)resp);
  }
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr(&local_90);
  std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr(&port);
  return (raptor_error)(Status *)name;
}

Assistant:

raptor_error raptor_blocking_resolve_address(
                                const char* name,
                                const char* default_port,
                                raptor_resolved_addresses** addresses) {

    struct addrinfo hints;
    struct addrinfo *result = nullptr, *resp;
    int s;
    size_t i;
    raptor_error err = RAPTOR_ERROR_NONE;

    /* parse name, splitting it into host and port parts */
    raptor::UniquePtr<char> host;
    raptor::UniquePtr<char> port;
    raptor::SplitHostPort(name, &host, &port);

    if (host == nullptr) {
        err = RAPTOR_ERROR_FROM_FORMAT("unparseable host:port (%s)", name);
        goto done;
    }

    if (port == nullptr) {
        if (default_port == nullptr) {
            err = RAPTOR_ERROR_FROM_FORMAT("no port in name (%s)", name);
            goto done;
        }
        port.reset(raptor_strdup(default_port));
    }

    /* Call getaddrinfo */
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC;     /* ipv4 or ipv6 */
    hints.ai_socktype = SOCK_STREAM; /* stream socket */
    hints.ai_flags = AI_PASSIVE;     /* for wildcard IP address */

    s = getaddrinfo(host.get(), port.get(), &hints, &result);
    if (s != 0) {
        /* Retry if well-known service name is recognized */
        const char* svc[][2] = {{"http", "80"}, {"https", "443"}};
        for (i = 0; i < RAPTOR_ARRAY_SIZE(svc); i++) {
            if (strcmp(port.get(), svc[i][0]) == 0) {
                s = getaddrinfo(host.get(), svc[i][1], &hints, &result);
                break;
            }
        }
    }

    if (s != 0) {
        err = RAPTOR_POSIX_ERROR("getaddrinfo");
        goto done;
    }

    /* Success path: set addrs non-NULL, fill it in */
    *addresses = static_cast<raptor_resolved_addresses*>(
        raptor::Malloc(sizeof(raptor_resolved_addresses)));
    (*addresses)->naddrs = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        (*addresses)->naddrs++;
    }
    (*addresses)->addrs = static_cast<raptor_resolved_address*>(
        raptor::Malloc(sizeof(raptor_resolved_address) * (*addresses)->naddrs));

    i = 0;
    for (resp = result; resp != nullptr; resp = resp->ai_next) {
        memcpy(&(*addresses)->addrs[i].addr, resp->ai_addr, resp->ai_addrlen);
        (*addresses)->addrs[i].len = resp->ai_addrlen;
        i++;
    }
    err = RAPTOR_ERROR_NONE;
done:
    if (result) {
        freeaddrinfo(result);
    }
    return err;
}